

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

bool helics::checkTypeMatch(string_view type1,string_view type2,bool strict_match)

{
  int iVar1;
  const_iterator cVar2;
  char *__s2;
  size_t sVar3;
  size_type __rlen;
  char *__s1;
  size_t __n;
  size_type __rlen_5;
  bool bVar4;
  key_type local_48;
  key_type local_38;
  
  __s1 = type1._M_str;
  __n = type1._M_len;
  __s2 = type2._M_str;
  sVar3 = type2._M_len;
  if (((__n != 0) &&
      ((local_48._M_len = sVar3, local_48._M_str = __s2, local_38._M_len = __n,
       local_38._M_str = __s1, __n != sVar3 || (iVar1 = bcmp(__s1,__s2,__n), iVar1 != 0)))) &&
     ((__n != 3 ||
      (((iVar1 = bcmp(__s1,"def",3), iVar1 != 0 && (iVar1 = bcmp(__s1,"any",3), iVar1 != 0)) &&
       (iVar1 = bcmp(__s1,"raw",3), iVar1 != 0)))))) {
    if (__n == 4) {
      iVar1 = bcmp(__s1,"json",4);
      bVar4 = iVar1 == 0;
    }
    else {
      bVar4 = false;
    }
    if (strict_match || bVar4 != false) {
      return bVar4;
    }
    if ((sVar3 != 0) &&
       ((sVar3 != 3 ||
        ((iVar1 = bcmp(__s2,"def",3), iVar1 != 0 && (iVar1 = bcmp(__s2,"any",3), iVar1 != 0)))))) {
      if ((__n == 4) && (iVar1 = bcmp(__s1,"json",4), iVar1 == 0)) {
        return true;
      }
      cVar2 = std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)convertible_set,&local_38);
      if (cVar2._M_node != (_Base_ptr)(convertible_set + 8)) {
        cVar2 = std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)convertible_set,&local_48);
        return cVar2._M_node != (_Base_ptr)(convertible_set + 8);
      }
      if (local_48._M_len == 3) {
        iVar1 = bcmp(local_48._M_str,"raw",3);
        return iVar1 == 0;
      }
      return false;
    }
  }
  return true;
}

Assistant:

bool checkTypeMatch(std::string_view type1, std::string_view type2, bool strict_match)
{
    if ((type1.empty()) || (type1 == type2) || (type1 == "def") || (type1 == "any") ||
        (type1 == "raw") || (type1 == "json")) {
        return true;
    }
    if (strict_match) {
        return false;
    }

    if ((type2.empty()) || (type2 == "def") || (type2 == "any") || (type1 == "json")) {
        return true;
    }
    if (convertible_set.find(type1) != convertible_set.end()) {
        return ((convertible_set.find(type2) != convertible_set.end()));
    }
    return (type2 == "raw");
}